

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

string * __thiscall
soul::Value::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,Value *this,StringDictionary *dictionary)

{
  undefined1 local_1a8 [8];
  DefaultPrinter p;
  StringDictionary *dictionary_local;
  Value *this_local;
  
  p._384_8_ = dictionary;
  getDescription::DefaultPrinter::DefaultPrinter((DefaultPrinter *)local_1a8);
  p.super_ValuePrinter._vptr_ValuePrinter = (_func_int **)p._384_8_;
  print(this,(ValuePrinter *)local_1a8);
  std::__cxx11::ostringstream::str();
  getDescription::DefaultPrinter::~DefaultPrinter((DefaultPrinter *)local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Value::getDescription (const StringDictionary* dictionary) const
{
    struct DefaultPrinter  : public ValuePrinter
    {
        void print (std::string_view s) override  { out << s; }
        std::ostringstream out;
    };

    DefaultPrinter p;
    p.dictionary = dictionary;
    print (p);
    return p.out.str();
}